

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

Variable *
skiwi::make_variable
          (Variable *__return_storage_ptr__,
          vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int iVar1;
  int column_nr;
  pointer ptVar2;
  pointer ptVar3;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_00;
  string local_60;
  string local_40;
  
  ptVar3 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ptVar2 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar3 == ptVar2) {
    anon_unknown_2::throw_parse_error(no_tokens);
    ptVar3 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((ptVar3 == ptVar2) || (ptVar2[-1].type != T_ID)) {
    iVar1 = ptVar2[-1].line_nr;
    column_nr = ptVar2[-1].column_nr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"",(allocator<char> *)&local_40);
    anon_unknown_2::throw_parse_error(iVar1,column_nr,bad_syntax,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  Variable::Variable(__return_storage_ptr__);
  ptVar3 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = ptVar3[-1].column_nr;
  __return_storage_ptr__->line_nr = ptVar3[-1].line_nr;
  __return_storage_ptr__->column_nr = iVar1;
  (anonymous_namespace)::current_abi_cxx11_(&local_40,(_anonymous_namespace_ *)tokens,tokens_00);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  anon_unknown_2::advance(tokens);
  return __return_storage_ptr__;
}

Assistant:

Variable make_variable(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  Variable v;
  v.line_nr = tokens.back().line_nr;
  v.column_nr = tokens.back().column_nr;
  v.name = current(tokens);
  advance(tokens);
  return v;
  }